

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O0

int speed_segment_start(mixed_segment *segment)

{
  long *plVar1;
  SRC_STATE *in_stack_ffffffffffffffd8;
  speed_segment_data *data;
  mixed_segment *segment_local;
  
  plVar1 = (long *)segment->data;
  if (plVar1[2] != 0) {
    src_reset(in_stack_ffffffffffffffd8);
  }
  if ((plVar1[1] == 0) || (*plVar1 == 0)) {
    mixed_err(0x16);
    segment_local._4_4_ = 0;
  }
  else {
    segment_local._4_4_ = 1;
  }
  return segment_local._4_4_;
}

Assistant:

int speed_segment_start(struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  if(data->resample_state)
    src_reset(data->resample_state);
  if(data->out == 0 || data->in == 0){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  return 1;
}